

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Var * __thiscall kratos::VarSlice::get_var_root_parent(VarSlice *this)

{
  Var *pVVar1;
  _func_int **local_30;
  
  pVVar1 = this->parent_var;
  while (pVVar1->type_ == Slice) {
    Var::as<kratos::VarSlice>((Var *)&stack0xffffffffffffffd0);
    pVVar1 = (Var *)local_30[0x4e];
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  }
  return pVVar1;
}

Assistant:

const Var *VarSlice::get_var_root_parent() const {
    Var *parent = parent_var;
    while (parent->type() == VarType::Slice) {
        parent = parent->as<VarSlice>()->parent_var;
    }
    return parent;
}